

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_source_get_length_in_pcm_frames(ma_data_source *pDataSource,ma_uint64 *pLength)

{
  long *in_RSI;
  long *in_RDI;
  ma_data_source_base *pDataSourceBase;
  ma_result local_4;
  
  if (in_RSI == (long *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    *in_RSI = 0;
    if (in_RDI == (long *)0x0) {
      local_4 = MA_INVALID_ARGS;
    }
    else if (in_RDI[2] == -1) {
      if (*(long *)(*in_RDI + 0x20) == 0) {
        local_4 = MA_NOT_IMPLEMENTED;
      }
      else {
        local_4 = (**(code **)(*in_RDI + 0x20))(in_RDI,in_RSI);
      }
    }
    else {
      *in_RSI = in_RDI[2] - in_RDI[1];
      local_4 = MA_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_data_source_get_length_in_pcm_frames(ma_data_source* pDataSource, ma_uint64* pLength)
{
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;

    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;

    if (pDataSourceBase == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ASSERT(pDataSourceBase->vtable != NULL);

    /*
    If we have a range defined we'll use that to determine the length. This is one of rare times
    where we'll actually trust the caller. If they've set the range, I think it's mostly safe to
    assume they've set it based on some higher level knowledge of the structure of the sound bank.
    */
    if (pDataSourceBase->rangeEndInFrames != ~((ma_uint64)0)) {
        *pLength = pDataSourceBase->rangeEndInFrames - pDataSourceBase->rangeBegInFrames;
        return MA_SUCCESS;
    }

    /*
    Getting here means a range is not defined so we'll need to get the data source itself to tell
    us the length.
    */
    if (pDataSourceBase->vtable->onGetLength == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    return pDataSourceBase->vtable->onGetLength(pDataSource, pLength);
}